

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::TrianglesAdjacencyGen
          (DrawIndirectBase *this,uint drawSizeX,uint drawSizeY,CColorArray *output)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar1;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  float local_38;
  uint local_34;
  float offsetX;
  uint j;
  float offsetY;
  uint i;
  float sizeY;
  float sizeX;
  CColorArray *output_local;
  uint drawSizeY_local;
  uint drawSizeX_local;
  DrawIndirectBase *this_local;
  
  i = (uint)(1.0 / (float)drawSizeX);
  offsetY = 1.0 / (float)drawSizeY;
  _sizeY = output;
  output_local._0_4_ = drawSizeY;
  output_local._4_4_ = drawSizeX;
  _drawSizeY_local = this;
  for (j = 0; j < output_local._4_4_; j = j + 1) {
    offsetX = offsetY * (float)j + -0.5;
    for (local_34 = 0; pvVar1 = _sizeY, local_34 < (uint)output_local; local_34 = local_34 + 1) {
      local_38 = (float)i * (float)local_34 + -0.5;
      tcu::Vector<float,_4>::Vector(&local_48,local_38,offsetX,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_48);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_58,local_38 - (float)i,offsetX + offsetY,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_58);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_68,local_38,offsetX + offsetY,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_68);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_78,local_38 + (float)i,offsetX + offsetY,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_78);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_88,local_38 + (float)i,offsetX,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_88);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_98,local_38 + (float)i,offsetX - offsetY,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_98);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_a8,local_38 + (float)i,offsetX + offsetY,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_a8);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_b8,(float)i + (float)i + local_38,offsetX,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_b8);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_c8,local_38 + (float)i,offsetX,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_c8);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_d8,local_38,offsetX,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_d8);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_e8,local_38,offsetX + offsetY,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_e8);
      pvVar1 = _sizeY;
      tcu::Vector<float,_4>::Vector(&local_f8,local_38,offsetY + offsetY + offsetX,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_f8);
    }
  }
  return;
}

Assistant:

void TrianglesAdjacencyGen(unsigned int drawSizeX, unsigned int drawSizeY, CColorArray& output)
	{
		float sizeX = 1.0f / static_cast<float>(drawSizeX);
		float sizeY = 1.0f / static_cast<float>(drawSizeY);

		for (unsigned int i = 0; i < drawSizeX; ++i)
		{
			float offsetY = -0.5f + sizeY * static_cast<float>(i);
			for (unsigned int j = 0; j < drawSizeY; ++j)
			{
				float offsetX = -0.5f + sizeX * static_cast<float>(j);

				output.push_back(tcu::Vec4(offsetX, offsetY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX - sizeX, offsetY + sizeY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX, offsetY + sizeY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX + sizeX, offsetY + sizeY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX + sizeX, offsetY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX + sizeX, offsetY - sizeY, 0.0f, 1.0f));

				output.push_back(tcu::Vec4(offsetX + sizeX, offsetY + sizeY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX + 2 * sizeX, offsetY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX + sizeX, offsetY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX, offsetY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX, offsetY + sizeY, 0.0f, 1.0f));
				output.push_back(tcu::Vec4(offsetX, offsetY + 2 * sizeY, 0.0f, 1.0f));
			}
		}
	}